

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# from_decimal.hpp
# Opt level: O1

bool duckdb::CastDecimalCInternal<duckdb::uhugeint_t>
               (duckdb_result *source,uhugeint_t *result,idx_t col,idx_t row)

{
  PhysicalType PVar1;
  byte width;
  uint8_t scale;
  bool bVar2;
  pointer pQVar3;
  reference type;
  InternalException *this;
  int64_t *piVar4;
  hugeint_t input;
  CastParameters parameters;
  uint8_t in_stack_ffffffffffffff78;
  CastParameters local_80;
  string local_50;
  
  pQVar3 = unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)source->internal_data);
  type = vector<duckdb::LogicalType,_true>::operator[](&(pQVar3->super_BaseQueryResult).types,col);
  width = DecimalType::GetWidth(type);
  scale = DecimalType::GetScale(type);
  piVar4 = (int64_t *)(row * 0x10 + (long)source->deprecated_columns[col].deprecated_data);
  local_80.cast_data.ptr = (BoundCastData *)0x0;
  local_80.strict = false;
  local_80.error_message = (string *)0x0;
  local_80.local_state.ptr = (FunctionLocalState *)0x0;
  local_80.query_location.index = 0xffffffffffffffff;
  local_80.nullify_parent = false;
  PVar1 = type->physical_type_;
  if (PVar1 < INT64) {
    if (PVar1 == INT16) {
      bVar2 = TryCastFromDecimal::Operation<short,duckdb::uhugeint_t>
                        ((int16_t)*piVar4,result,&local_80,width,scale);
    }
    else {
      if (PVar1 != INT32) {
LAB_00c52bd9:
        this = (InternalException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Unimplemented internal type for decimal","");
        InternalException::InternalException(this,&local_50);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      bVar2 = TryCastFromDecimal::Operation<int,duckdb::uhugeint_t>
                        ((int32_t)*piVar4,result,&local_80,width,scale);
    }
  }
  else if (PVar1 == INT64) {
    bVar2 = TryCastFromDecimal::Operation<long,duckdb::uhugeint_t>
                      (*piVar4,result,&local_80,width,scale);
  }
  else {
    if (PVar1 != INT128) goto LAB_00c52bd9;
    input.upper = (int64_t)result;
    input.lower = piVar4[1];
    bVar2 = TryCastFromDecimal::Operation<duckdb::hugeint_t,duckdb::uhugeint_t>
                      ((TryCastFromDecimal *)*piVar4,input,(uhugeint_t *)&local_80,
                       (CastParameters *)(ulong)width,scale,in_stack_ffffffffffffff78);
  }
  return bVar2;
}

Assistant:

bool CastDecimalCInternal(duckdb_result *source, RESULT_TYPE &result, idx_t col, idx_t row) {
	auto result_data = (duckdb::DuckDBResultData *)source->internal_data;
	auto &query_result = result_data->result;
	auto &source_type = query_result->types[col];
	auto width = duckdb::DecimalType::GetWidth(source_type);
	auto scale = duckdb::DecimalType::GetScale(source_type);
	void *source_address = UnsafeFetchPtr<hugeint_t>(source, col, row);

	CastParameters parameters;
	switch (source_type.InternalType()) {
	case duckdb::PhysicalType::INT16:
		return duckdb::TryCastFromDecimal::Operation<int16_t, RESULT_TYPE>(UnsafeFetchFromPtr<int16_t>(source_address),
		                                                                   result, parameters, width, scale);
	case duckdb::PhysicalType::INT32:
		return duckdb::TryCastFromDecimal::Operation<int32_t, RESULT_TYPE>(UnsafeFetchFromPtr<int32_t>(source_address),
		                                                                   result, parameters, width, scale);
	case duckdb::PhysicalType::INT64:
		return duckdb::TryCastFromDecimal::Operation<int64_t, RESULT_TYPE>(UnsafeFetchFromPtr<int64_t>(source_address),
		                                                                   result, parameters, width, scale);
	case duckdb::PhysicalType::INT128:
		return duckdb::TryCastFromDecimal::Operation<hugeint_t, RESULT_TYPE>(
		    UnsafeFetchFromPtr<hugeint_t>(source_address), result, parameters, width, scale);
	default:
		throw duckdb::InternalException("Unimplemented internal type for decimal");
	}
}